

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderAtomicExchangeCase::verify
          (ShaderAtomicExchangeCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  int iVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  int in_stack_00000008;
  long in_stack_00000010;
  bool local_422;
  bool local_3d9;
  MessageBuilder local_3d0;
  _Self local_250;
  _Self local_248;
  _Base_ptr local_240;
  undefined1 local_238;
  int local_22c;
  MessageBuilder local_228;
  _Self local_a8 [3];
  _Self local_90;
  int local_88;
  int local_84;
  int outputValue;
  int localNdx;
  set<int,_std::less<int>,_std::allocator<int>_> usedValues;
  int groupOutput;
  int groupOffset;
  int groupNdx;
  int numWorkGroups;
  int workGroupSize;
  void *outputs_local;
  size_t sStack_28;
  int outputStride_local;
  void *inputs_local;
  int inputStride_local;
  int numValues_local;
  ShaderAtomicExchangeCase *this_local;
  
  outputs_local._4_4_ = (int)tbs;
  inputs_local._4_4_ = (int)ctx;
  inputs_local._0_4_ = SUB84(sig,0);
  _numWorkGroups = tbslen;
  sStack_28 = siglen;
  _inputStride_local = this;
  groupNdx = product<unsigned_int,3>(&(this->super_ShaderAtomicOpCase).m_workGroupSize);
  groupOffset = inputs_local._4_4_ / groupNdx;
  for (groupOutput = 0; groupOutput < groupOffset; groupOutput = groupOutput + 1) {
    iVar2 = groupOutput * groupNdx;
    usedValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         *(int *)(in_stack_00000010 + groupOutput * in_stack_00000008);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&outputValue);
    for (local_84 = 0; local_84 < groupNdx; local_84 = local_84 + 1) {
      local_88 = *(int *)(_numWorkGroups + (long)(outputs_local._4_4_ * (iVar2 + local_84)));
      bVar1 = de::inRange<int>(local_88,0,groupNdx);
      local_3d9 = true;
      if (bVar1) {
        local_90._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::find
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&outputValue,&local_88);
        local_a8[0]._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&outputValue);
        local_3d9 = std::operator!=(&local_90,local_a8);
      }
      if (local_3d9 != false) {
        pTVar3 = tcu::TestContext::getLog
                           ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_228,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<(&local_228,(char (*) [17])"ERROR: at group ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&groupOutput);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])", invocation ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_84);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [26])": found unexpected value ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_88);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_228);
        this_local._7_1_ = 0;
        local_22c = 1;
        goto LAB_020f972a;
      }
      pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&outputValue,&local_88);
      local_240 = (_Base_ptr)pVar5.first._M_node;
      local_238 = pVar5.second;
    }
    bVar1 = de::inRange<int>(usedValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,0,
                             groupNdx);
    local_422 = true;
    if (bVar1) {
      local_248._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&outputValue,
                      (key_type_conflict *)
                      ((long)&usedValues._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
      local_250._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&outputValue);
      local_422 = std::operator!=(&local_248,&local_250);
    }
    if (local_422 == false) {
      local_22c = 0;
    }
    else {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3d0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_3d0,(char (*) [17])"ERROR: at group ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&groupOutput);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])": unexpected final value");
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(int *)((long)&usedValues._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count + 4));
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3d0);
      this_local._7_1_ = 0;
      local_22c = 1;
    }
LAB_020f972a:
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&outputValue);
    if (local_22c != 0) goto LAB_020f9760;
  }
  this_local._7_1_ = 1;
  local_22c = groupOutput;
LAB_020f9760:
  return CONCAT31((int3)((uint)local_22c >> 8),this_local._7_1_) & 0xffffff01;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		DE_UNREF(inputStride && inputs);

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<int>	usedValues;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int outputValue = *(const deInt32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!de::inRange(outputValue, 0, workGroupSize) || usedValues.find(outputValue) != usedValues.end())
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << outputValue
									   << TestLog::EndMessage;
					return false;
				}
				usedValues.insert(outputValue);
			}

			if (!de::inRange(groupOutput, 0, workGroupSize) || usedValues.find(groupOutput) != usedValues.end())
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": unexpected final value" << groupOutput << TestLog::EndMessage;
				return false;
			}
		}

		return true;
	}